

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O0

JsErrorCode
JsDiagEvaluate(JsValueRef expressionVal,uint stackFrameIndex,JsParseScriptAttributes parseAttributes
              ,bool forceSetValueProp,JsValueRef *evalResult)

{
  anon_class_40_5_e3f3700a fn;
  JsErrorCode JVar1;
  JsValueRef *local_28;
  JsValueRef *evalResult_local;
  JsParseScriptAttributes local_18;
  uint uStack_14;
  bool forceSetValueProp_local;
  JsParseScriptAttributes parseAttributes_local;
  uint stackFrameIndex_local;
  JsValueRef expressionVal_local;
  
  fn.evalResult = &local_28;
  fn.expressionVal = (JsValueRef *)&parseAttributes_local;
  fn.parseAttributes = &local_18;
  fn.stackFrameIndex = &stack0xffffffffffffffec;
  fn.forceSetValueProp = (bool *)((long)&evalResult_local + 7);
  local_28 = evalResult;
  evalResult_local._7_1_ = forceSetValueProp;
  local_18 = parseAttributes;
  uStack_14 = stackFrameIndex;
  _parseAttributes_local = expressionVal;
  JVar1 = ContextAPINoScriptWrapper_NoRecord<JsDiagEvaluate::__0>(fn,false,true);
  return JVar1;
}

Assistant:

CHAKRA_API JsDiagEvaluate(
    _In_ JsValueRef expressionVal,
    _In_ unsigned int stackFrameIndex,
    _In_ JsParseScriptAttributes parseAttributes,
    _In_ bool forceSetValueProp,
    _Out_ JsValueRef *evalResult)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {

        PARAM_NOT_NULL(expressionVal);
        PARAM_NOT_NULL(evalResult);

        bool isArrayBuffer = Js::VarIs<Js::ArrayBuffer>(expressionVal),
             isString = false;
        bool isUtf8   = !(parseAttributes & JsParseScriptAttributeArrayBufferIsUtf16Encoded);

        if (!isArrayBuffer)
        {
            isString = Js::VarIs<Js::JavascriptString>(expressionVal);
            if (!isString)
            {
                return JsErrorInvalidArgument;
            }
        }

        const size_t len = isArrayBuffer ?
            Js::VarTo<Js::ArrayBuffer>(expressionVal)->GetByteLength() :
            Js::VarTo<Js::JavascriptString>(expressionVal)->GetLength();

        if (len > INT_MAX)
        {
            return JsErrorInvalidArgument;
        }

        const WCHAR* expression;
        utf8::NarrowToWide wide_expression;
        if (isArrayBuffer && isUtf8)
        {
            wide_expression.Initialize(
                (const char*)Js::VarTo<Js::ArrayBuffer>(expressionVal)->GetBuffer(), len);
            if (!wide_expression)
            {
                return JsErrorOutOfMemory;
            }
            expression = wide_expression;
        }
        else
        {
            expression = !isArrayBuffer ?
                Js::VarTo<Js::JavascriptString>(expressionVal)->GetSz() // String
                :
                (const WCHAR*)Js::VarTo<Js::ArrayBuffer>(expressionVal)->GetBuffer(); // ArrayBuffer;
        }

        *evalResult = JS_INVALID_REFERENCE;

        JsrtContext* context = JsrtContext::GetCurrent();
        JsrtRuntime* runtime = context->GetRuntime();

        VALIDATE_RUNTIME_IS_AT_BREAK(runtime);

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();

        VALIDATE_IS_DEBUGGING(jsrtDebugManager);

        JsrtDebuggerStackFrame* debuggerStackFrame = nullptr;
        if (!jsrtDebugManager->TryGetFrameObjectFromFrameIndex(scriptContext, stackFrameIndex, &debuggerStackFrame))
        {
            return JsErrorDiagObjectNotFound;
        }

        Js::DynamicObject* result = nullptr;
        bool success = debuggerStackFrame->Evaluate(scriptContext, expression, static_cast<int>(len), false, forceSetValueProp, &result);

        if (result != nullptr)
        {
            *evalResult = result;
        }

        return success ? JsNoError : JsErrorScriptException;

    }, false /*allowInObjectBeforeCollectCallback*/, true /*scriptExceptionAllowed*/);
#endif
}